

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

char * string_feeder_peek_length(string_feeder_t *sf,size_t length)

{
  ulong uVar1;
  ulong uVar2;
  void *__dest;
  char *pcVar3;
  size_t __n;
  
  if (sf == (string_feeder_t *)0x0) {
    __assert_fail("sf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x20d,"char *string_feeder_peek_length(string_feeder_t *, size_t)");
  }
  uVar1 = sf->len;
  uVar2 = sf->pos;
  if (uVar2 <= uVar1) {
    __n = uVar1 - uVar2;
    if (uVar2 + length <= uVar1) {
      __n = length;
    }
    __dest = calloc(__n + 1,1);
    pcVar3 = (char *)memcpy(__dest,sf->s + uVar2,__n);
    return pcVar3;
  }
  __assert_fail("sf->pos <= sf->len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x20f,"char *string_feeder_peek_length(string_feeder_t *, size_t)");
}

Assistant:

char *string_feeder_peek_length(string_feeder_t *sf, size_t length)
{
    assert(sf != NULL);
    assert(length >= 0);
    assert(sf->pos <= sf->len);

    if (sf->pos + length > sf->len)
        length = sf->len - sf->pos;

    char *substr = calloc(length+1, sizeof(char));
    memcpy(substr, &sf->s[sf->pos], length*sizeof(char));
    return substr;
}